

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O0

bool google::protobuf::compiler::csharp::RequiresPresenceBit(FieldDescriptor *descriptor)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  undefined1 local_11;
  FieldDescriptor *descriptor_local;
  
  bVar1 = SupportsPresenceApi(descriptor);
  local_11 = 0;
  if (bVar1) {
    bVar1 = IsNullable(descriptor);
    local_11 = 0;
    if (!bVar1) {
      bVar1 = FieldDescriptor::is_extension(descriptor);
      local_11 = 0;
      if (!bVar1) {
        pOVar2 = FieldDescriptor::real_containing_oneof(descriptor);
        local_11 = pOVar2 != (OneofDescriptor *)0x0 ^ 0xff;
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

inline bool RequiresPresenceBit(const FieldDescriptor* descriptor) {
  return SupportsPresenceApi(descriptor) &&
    !IsNullable(descriptor) &&
    !descriptor->is_extension() &&
    !descriptor->real_containing_oneof();
}